

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::sortMaxUp
          (btAxisSweep3Internal<unsigned_short> *this,int axis,unsigned_short edge,
          btDispatcher *param_3,bool updateOverlaps)

{
  unsigned_short *puVar1;
  short *psVar2;
  ushort uVar3;
  ushort uVar4;
  Handle *pHVar5;
  Handle *pHVar6;
  btOverlappingPairCallback *pbVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint axis0;
  undefined6 in_register_00000012;
  Handle *pHVar11;
  Handle *pHVar12;
  Edge *pEVar13;
  bool bVar14;
  
  lVar9 = (long)axis;
  pEVar13 = this->m_pEdges[lVar9] + (CONCAT62(in_register_00000012,edge) & 0xffffffff);
  uVar3 = pEVar13->m_handle;
  pHVar5 = this->m_pHandles;
  axis0 = 1 << ((byte)axis & 0x1f) & 3;
  lVar8 = 0x3c;
  for (; (uVar4 = pEVar13[1].m_handle, (ulong)uVar4 != 0 && (pEVar13[1].m_pos <= pEVar13->m_pos));
      pEVar13 = pEVar13 + 1) {
    pHVar6 = this->m_pHandles;
    bVar14 = (pEVar13[1].m_pos & 1) == 0;
    lVar10 = 0x42;
    if (bVar14) {
      lVar10 = lVar8;
    }
    if (bVar14 && updateOverlaps) {
      bVar14 = testOverlap2D(this,pHVar5 + uVar3,pHVar6 + uVar4,axis0,1 << (sbyte)axis0 & 3);
      lVar10 = lVar8;
      if (bVar14) {
        pHVar11 = this->m_pHandles + pEVar13->m_handle;
        pHVar12 = this->m_pHandles + pEVar13[1].m_handle;
        (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[2])
                  (this->m_pairCache,pHVar11,pHVar12);
        pbVar7 = this->m_userPairCallback;
        if (pbVar7 != (btOverlappingPairCallback *)0x0) {
          (*pbVar7->_vptr_btOverlappingPairCallback[2])(pbVar7,pHVar11,pHVar12);
        }
      }
    }
    psVar2 = (short *)((long)pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMin.m_floats +
                      lVar9 * 2 + lVar10 + -0x1c);
    *psVar2 = *psVar2 + -1;
    puVar1 = pHVar5[uVar3].m_maxEdges + lVar9;
    *puVar1 = *puVar1 + 1;
    *(ulong *)pEVar13 =
         CONCAT44((int)*(undefined8 *)pEVar13,(int)((ulong)*(undefined8 *)pEVar13 >> 0x20));
  }
  return;
}

Assistant:

void btAxisSweep3Internal<BP_FP_INT_TYPE>::sortMaxUp(int axis, BP_FP_INT_TYPE edge, btDispatcher* /* dispatcher */, bool updateOverlaps)
{
	Edge* pEdge = m_pEdges[axis] + edge;
	Edge* pNext = pEdge + 1;
	Handle* pHandleEdge = getHandle(pEdge->m_handle);

	while (pNext->m_handle && (pEdge->m_pos >= pNext->m_pos))
	{
		Handle* pHandleNext = getHandle(pNext->m_handle);

		const int axis1 = (1  << axis) & 3;
		const int axis2 = (1  << axis1) & 3;

		if (!pNext->IsMax())
		{
			// if next edge is a minimum check the bounds and add an overlap if necessary
			if (updateOverlaps && testOverlap2D(pHandleEdge, pHandleNext,axis1,axis2))
			{
				Handle* handle0 = getHandle(pEdge->m_handle);
				Handle* handle1 = getHandle(pNext->m_handle);
				m_pairCache->addOverlappingPair(handle0,handle1);
				if (m_userPairCallback)
					m_userPairCallback->addOverlappingPair(handle0,handle1);
			}

			// update edge reference in other handle
			pHandleNext->m_minEdges[axis]--;
		}
		else
			pHandleNext->m_maxEdges[axis]--;

		pHandleEdge->m_maxEdges[axis]++;

		// swap the edges
		Edge swap = *pEdge;
		*pEdge = *pNext;
		*pNext = swap;

		// increment
		pEdge++;
		pNext++;
	}
	
}